

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x11_window.c
# Opt level: O2

void acquireMonitor(_GLFWwindow *window)

{
  int ypos;
  int xpos;
  GLFWvidmode mode;
  
  if (_glfw.x11.saver.count == 0) {
    XGetScreenSaver(_glfw.x11.display,0x2030f0,0x2030f4,0x2030f8,0x2030fc);
    XSetScreenSaver(_glfw.x11.display,0,0,0,2);
  }
  if (window->monitor->window == (_GLFWwindow *)0x0) {
    _glfw.x11.saver.count = _glfw.x11.saver.count + 1;
  }
  _glfwSetVideoModeX11(window->monitor,&window->videoMode);
  if ((window->x11).overrideRedirect != 0) {
    _glfwPlatformGetMonitorPos(window->monitor,&xpos,&ypos);
    _glfwPlatformGetVideoMode(window->monitor,&mode);
    XMoveResizeWindow(_glfw.x11.display,(window->x11).handle,xpos,ypos,mode.width,mode.height);
  }
  _glfwInputMonitorWindow(window->monitor,window);
  return;
}

Assistant:

static void acquireMonitor(_GLFWwindow* window)
{
    if (_glfw.x11.saver.count == 0)
    {
        // Remember old screen saver settings
        XGetScreenSaver(_glfw.x11.display,
                        &_glfw.x11.saver.timeout,
                        &_glfw.x11.saver.interval,
                        &_glfw.x11.saver.blanking,
                        &_glfw.x11.saver.exposure);

        // Disable screen saver
        XSetScreenSaver(_glfw.x11.display, 0, 0, DontPreferBlanking,
                        DefaultExposures);
    }

    if (!window->monitor->window)
        _glfw.x11.saver.count++;

    _glfwSetVideoModeX11(window->monitor, &window->videoMode);

    if (window->x11.overrideRedirect)
    {
        int xpos, ypos;
        GLFWvidmode mode;

        // Manually position the window over its monitor
        _glfwPlatformGetMonitorPos(window->monitor, &xpos, &ypos);
        _glfwPlatformGetVideoMode(window->monitor, &mode);

        XMoveResizeWindow(_glfw.x11.display, window->x11.handle,
                          xpos, ypos, mode.width, mode.height);
    }

    _glfwInputMonitorWindow(window->monitor, window);
}